

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_manager.cpp
# Opt level: O1

void __thiscall cfd::CfdManager::Initialize(CfdManager *this)

{
  CfdException *this_00;
  undefined1 local_40 [32];
  
  if (this->finalized_ != true) {
    if (this->initialized_ == false) {
      core::Initialize(&this->handle_);
      this->initialized_ = true;
      local_40._0_8_ = "cfd_manager.cpp";
      local_40._8_4_ = 0x2f;
      local_40._16_8_ = "Initialize";
      core::logger::log<>((CfdSourceLocation *)local_40,kCfdLogLevelInfo,"cfd initialize.");
    }
    return;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Initialize already finalized.","");
  core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void CfdManager::Initialize() {
  if (finalized_) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Initialize already finalized.");
  }

  if (!initialized_) {
    cfd::core::Initialize(&handle_);
    initialized_ = true;
    info(CFD_LOG_SOURCE, "cfd initialize.");
  }
}